

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void svd_sort(double *U,int M,int N,double *V,double *q)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  int *pos_00;
  int *pos;
  double *qq;
  double *VT;
  double *UT;
  int j;
  int i;
  double *q_local;
  double *V_local;
  int N_local;
  int M_local;
  double *U_local;
  
  __ptr = malloc((long)N * 8 * (long)M);
  __ptr_00 = malloc((long)N * 8 * (long)N);
  __ptr_01 = malloc((long)N << 3);
  pos_00 = (int *)malloc((long)N << 2);
  for (UT._4_4_ = 0; UT._4_4_ < N; UT._4_4_ = UT._4_4_ + 1) {
    *(double *)((long)__ptr_01 + (long)UT._4_4_ * 8) = q[UT._4_4_];
  }
  for (UT._4_4_ = 0; UT._4_4_ < M * N; UT._4_4_ = UT._4_4_ + 1) {
    *(double *)((long)__ptr + (long)UT._4_4_ * 8) = U[UT._4_4_];
  }
  for (UT._4_4_ = 0; UT._4_4_ < N * N; UT._4_4_ = UT._4_4_ + 1) {
    *(double *)((long)__ptr_00 + (long)UT._4_4_ * 8) = V[UT._4_4_];
  }
  sort1d(q,N,pos_00);
  for (UT._4_4_ = 0; UT._4_4_ < N; UT._4_4_ = UT._4_4_ + 1) {
    q[UT._4_4_] = *(double *)((long)__ptr_01 + (long)pos_00[UT._4_4_] * 8);
    for (UT._0_4_ = 0; (int)UT < M; UT._0_4_ = (int)UT + 1) {
      U[(int)UT * N + UT._4_4_] =
           *(double *)((long)__ptr + (long)((int)UT * N + pos_00[UT._4_4_]) * 8);
    }
    for (UT._0_4_ = 0; (int)UT < N; UT._0_4_ = (int)UT + 1) {
      V[(int)UT * N + UT._4_4_] =
           *(double *)((long)__ptr_00 + (long)((int)UT * N + pos_00[UT._4_4_]) * 8);
    }
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(pos_00);
  return;
}

Assistant:

void svd_sort(double *U,int M,int N,double *V,double *q) {
	/*
	 * Pavel Sakov's CSA SVD sort routine is used with some minor
	 * modifications. See The License below
	 */
	/*
	 * Copyright (C) 2000-2008 Pavel Sakov and CSIRO

Redistribution and use of material from the package `csa', with or without
modification, are permitted provided that the following conditions are
met:

1. Redistributions of material must retain the above copyright notice, this
list of conditions and the following disclaimer.
2. The names of the authors may not be used to endorse or promote products
derived from this software without specific prior written permission.

THIS SOFTWARE IS PROVIDED BY THE AUTHORS ``AS IS'' AND ANY EXPRESS OR IMPLIED
WARRANTIES, INCLUDING, BUT NOT LIMITED TO, THE IMPLIED WARRANTIES OF
MERCHANTABILITY AND FITNESS FOR A PARTICULAR PURPOSE ARE DISCLAIMED. IN NO
EVENT SHALL THE AUTHORS BE LIABLE FOR ANY DIRECT, INDIRECT, INCIDENTAL, SPECIAL,
EXEMPLARY, OR CONSEQUENTIAL DAMAGES (INCLUDING, BUT NOT LIMITED TO, PROCUREMENT
OF SUBSTITUTE GOODS OR SERVICES; LOSS OF USE, DATA, OR PROFITS; OR BUSINESS
INTERRUPTION) HOWEVER CAUSED AND ON ANY THEORY OF LIABILITY, WHETHER IN
CONTRACT, STRICT LIABILITY, OR TORT (INCLUDING NEGLIGENCE OR OTHERWISE) ARISING
IN ANY WAY OUT OF THE USE OF THIS SOFTWARE, EVEN IF ADVISED OF THE POSSIBILITY
OF SUCH DAMAGE.
	 */
	int i,j;
	double *UT,*VT,*qq;
	int *pos;

	UT = (double*) malloc(sizeof(double) * N * M);
	VT = (double*) malloc(sizeof(double) * N * N);
	qq = (double*) malloc(sizeof(double) * N);
	pos = (int*) malloc(sizeof(int) * N);

	for(i = 0;i < N;++i) {
		qq[i] = q[i];
	}

	for(i = 0;i < M*N;++i) {
		UT[i] = U[i];
	}

	for(i = 0;i < N*N;++i) {
		VT[i] = V[i];
	}

	//mtranspose(U,M,N,UT);
	//mtranspose(V,N,N,VT);

	sort1d(q,N,pos);

	for(i = 0; i < N;++i) {
		q[i] = qq[pos[i]];

		for (j = 0; j < M;++j) {
			U[j*N+i] = UT[j*N+pos[i]];
		}
		for (j = 0; j < N;++j) {
			V[j*N+i] = VT[j*N+pos[i]];
		}
	}

	free(UT);
	free(VT);
	free(qq);
	free(pos);

}